

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digraph.cc
# Opt level: O2

AdjVertex * __thiscall
bidirectional::DiGraph::getAdjVertex
          (AdjVertex *__return_storage_ptr__,DiGraph *this,LemonArc *arc,bool *forward)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  LemonNode local_24;
  Vertex local_20;
  
  lVar1 = *(long *)&(((vector<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                       *)((long)&(((this->lemon_graph_ptr)._M_t.
                                   super___uniq_ptr_impl<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_lemon::SmartDigraph_*,_std::default_delete<lemon::SmartDigraph>_>
                                   .super__Head_base<0UL,_lemon::SmartDigraph_*,_false>._M_head_impl
                                  )->super_ExtendedSmartDigraphBase).super_SmartDigraphBase + 0x18))
                    ->
                    super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                    )._M_impl;
  lVar3 = (long)arc->_id * 0x10;
  piVar2 = (int *)(lVar1 + lVar3 + 4);
  if (*forward != false) {
    piVar2 = (int *)(lVar1 + lVar3);
  }
  local_24._id = *piVar2;
  local_20 = getVertexFromLNode(this,&local_24);
  AdjVertex::AdjVertex
            (__return_storage_ptr__,&local_20,
             (double *)
             ((long)arc->_id * 8 +
             *(long *)&(((Container *)
                        ((long)&(((this->weight_map_ptr)._M_t.
                                  super___uniq_ptr_impl<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_*,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                                  .
                                  super__Head_base<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_*,_false>
                                 ._M_head_impl)->
                                super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>_>
                                ).
                                super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>
                        + 0x18))->super__Vector_base<double,_std::allocator<double>_>)._M_impl),
             *(Value **)
              ((long)&(((this->res_map_ptr)._M_t.
                        super___uniq_ptr_impl<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>_*,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>_>_>
                        .
                        super__Head_base<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>_*,_false>
                       ._M_head_impl)->
                      super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>_>
                      ).
                      super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
              + 0x20) + arc->_id);
  return __return_storage_ptr__;
}

Assistant:

AdjVertex DiGraph::getAdjVertex(const LemonArc& arc, const bool& forward)
    const {
  LemonNode node;
  if (forward) {
    node = head(arc);
  } else {
    node = tail(arc);
  }
  const Vertex&              vertex               = getVertexFromLNode(node);
  const double&              weight               = getWeight(arc);
  const std::vector<double>& resource_consumption = getRes(arc);
  return AdjVertex(vertex, weight, resource_consumption);
}